

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::AllReader>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::AllReader> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ArrayBuilder<kj::Array<unsigned_char>_>::dispose
              ((ArrayBuilder<kj::Array<unsigned_char>_> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }